

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Holding.cpp
# Opt level: O0

void __thiscall Holding::Holding(Holding *this,string *n,int t,int spT,int c,int val)

{
  string local_48 [32];
  int local_28;
  int local_24;
  int val_local;
  int c_local;
  int spT_local;
  int t_local;
  string *n_local;
  Holding *this_local;
  
  local_28 = val;
  local_24 = c;
  val_local = spT;
  c_local = t;
  _spT_local = n;
  n_local = (string *)this;
  std::__cxx11::string::string(local_48,(string *)n);
  BlackCard::BlackCard(&this->super_BlackCard,(string *)local_48,c_local);
  std::__cxx11::string::~string(local_48);
  (this->super_BlackCard).super_Card._vptr_Card = (_func_int **)&PTR_effectBonus_0012b360;
  std::__cxx11::string::string((string *)&this->name);
  std::__cxx11::string::operator=((string *)&this->name,(string *)n);
  this->typeH = val_local;
  this->tapped = false;
  this->revealed = false;
  this->cost = local_24;
  this->harvestValue = local_28;
  this->subHolding = (Holding *)0x0;
  this->upperHolding = (Holding *)0x0;
  return;
}

Assistant:

Holding::Holding(string n, int t, int spT, int c, int val): BlackCard{n, t}
{
    name = n;
    typeH = Holdings(spT);

    tapped = false;
    revealed = false;

    cost = c;
    harvestValue = val;

    subHolding = nullptr;
    upperHolding = nullptr;
}